

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_nonfinite<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,bool isnan,format_specs specs,sign s)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  basic_appender<char> bVar4;
  byte in_SIL;
  bool is_zero_fill;
  size_t size;
  size_t str_size;
  char *str;
  char in_stack_ffffffffffffff7f;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  buffer<char> *in_stack_ffffffffffffff88;
  basic_appender<char> in_stack_ffffffffffffff98;
  buffer<char> *specs_00;
  basic_specs local_20 [4];
  
  if ((in_SIL & 1) == 0) {
    bVar1 = basic_specs::upper(local_20);
    if (bVar1) {
      in_stack_ffffffffffffff88 = (buffer<char> *)0x81f4f7;
      specs_00 = in_stack_ffffffffffffff88;
    }
    else {
      in_stack_ffffffffffffff88 = (buffer<char> *)0x81f5e1;
      specs_00 = in_stack_ffffffffffffff88;
    }
  }
  else {
    bVar1 = basic_specs::upper(local_20);
    if (bVar1) {
      specs_00 = (buffer<char> *)0x81f613;
      in_stack_ffffffffffffff98.container = specs_00;
    }
    else {
      specs_00 = (buffer<char> *)0x81bfe0;
      in_stack_ffffffffffffff98.container = specs_00;
    }
  }
  sVar3 = basic_specs::fill_size(local_20);
  uVar5 = false;
  if (sVar3 == 1) {
    cVar2 = basic_specs::fill_unit<char>(local_20);
    uVar5 = cVar2 == '0';
  }
  if ((bool)uVar5 != false) {
    basic_specs::set_fill
              ((basic_specs *)CONCAT17(uVar5,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7f);
  }
  bVar4 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_nonfinite<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,bool,fmt::v11::format_specs,fmt::v11::sign)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (in_stack_ffffffffffffff98,specs_00,in_stack_ffffffffffffff88,
                     (anon_class_16_2_fa5d9fc7 *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isnan,
                                     format_specs specs, sign s) -> OutputIt {
  auto str =
      isnan ? (specs.upper() ? "NAN" : "nan") : (specs.upper() ? "INF" : "inf");
  constexpr size_t str_size = 3;
  auto size = str_size + (s != sign::none ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill_size() == 1 && specs.fill_unit<Char>() == '0';
  if (is_zero_fill) specs.set_fill(' ');
  return write_padded<Char>(out, specs, size,
                            [=](reserve_iterator<OutputIt> it) {
                              if (s != sign::none)
                                *it++ = detail::getsign<Char>(s);
                              return copy<Char>(str, str + str_size, it);
                            });
}